

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd_huffman.c
# Opt level: O1

size_t nghttp2_hd_huff_encode_count(uint8_t *src,size_t len)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = 0;
  if (len != 0) {
    sVar2 = 0;
    do {
      sVar1 = sVar1 + huff_sym_table[src[sVar2]].nbits;
      sVar2 = sVar2 + 1;
    } while (len != sVar2);
    sVar1 = sVar1 + 7 >> 3;
  }
  return sVar1;
}

Assistant:

size_t nghttp2_hd_huff_encode_count(const uint8_t *src, size_t len) {
  size_t i;
  size_t nbits = 0;

  for (i = 0; i < len; ++i) {
    nbits += huff_sym_table[src[i]].nbits;
  }
  /* pad the prefix of EOS (256) */
  return (nbits + 7) / 8;
}